

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  void *pvVar6;
  long *plVar7;
  float *pfVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Layer *pLVar13;
  long lVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  int iVar18;
  uint _w;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_bordered;
  void *local_b20;
  long local_b10;
  ModelBinFromMatArray local_ac8;
  undefined8 uStack_ab8;
  undefined4 uStack_ab0;
  long *local_aa8;
  undefined4 local_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a98;
  undefined4 uStack_a94;
  undefined8 local_a90;
  long local_a88;
  void *local_a80;
  long local_a78;
  long local_a70;
  ulong local_a68;
  ulong local_a60;
  void *local_a58;
  long local_a50;
  void *local_a48;
  void *local_a40;
  Mat local_a38;
  void *local_9f8;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  int iStack_9e0;
  Allocator *local_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  size_t local_9c0;
  void *local_9b8;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  int iStack_9a0;
  Allocator *local_998;
  undefined8 local_990;
  undefined8 uStack_988;
  size_t local_980;
  float *local_978;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined4 uStack_960;
  long *local_958;
  undefined4 local_950;
  undefined4 uStack_94c;
  undefined4 uStack_948;
  undefined4 uStack_944;
  undefined8 local_940;
  undefined1 local_938 [32];
  Allocator *local_918;
  Allocator *pAStack_910;
  int iStack_90c;
  undefined8 local_908;
  size_t asStack_900 [282];
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar9 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar9;
  }
  if (((bottom_blob->dims == 1) && (this->kernel_w == 1)) && (this->kernel_h == 1)) {
    iVar18 = this->weight_data_size / this->num_output;
    iVar9 = bottom_blob->w;
    if (iVar9 == iVar18) {
      pLVar13 = create_layer(0xf);
      ParamDict::ParamDict((ParamDict *)local_938);
      ParamDict::set((ParamDict *)local_938,0,this->num_output);
      ParamDict::set((ParamDict *)local_938,1,this->bias_term);
      ParamDict::set((ParamDict *)local_938,2,this->weight_data_size);
      ParamDict::set((ParamDict *)local_938,8,this->int8_scale_term);
      (*pLVar13->_vptr_Layer[2])(pLVar13,local_938);
      lVar14 = 0;
      do {
        *(undefined8 *)((long)&local_a38.refcount + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_a38.elemsize + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_a38.data + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.refcount + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.allocator + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.dims + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.h + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.cstep + lVar14) = 0;
        lVar14 = lVar14 + 0x40;
      } while (lVar14 != 0x100);
      if (&local_a38 != &this->weight_data) {
        piVar4 = (this->weight_data).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(local_a38.refcount._4_4_,local_a38.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_a38.allocator == (Allocator *)0x0) {
              if (local_a38.data != (void *)0x0) {
                free(local_a38.data);
              }
            }
            else {
              (**(code **)(*(long *)local_a38.allocator + 0x18))();
            }
          }
        }
        local_a38.data = (this->weight_data).data;
        piVar4 = (this->weight_data).refcount;
        local_a38.refcount._0_4_ = SUB84(piVar4,0);
        local_a38.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
        sVar5 = (this->weight_data).elemsize;
        local_a38.elemsize._0_4_ = (undefined4)sVar5;
        local_a38.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
        local_a38.elempack = (this->weight_data).elempack;
        local_a38.allocator = (this->weight_data).allocator;
        local_a38.dims = (this->weight_data).dims;
        local_a38.w = (this->weight_data).w;
        local_a38.h = (this->weight_data).h;
        local_a38.c = (this->weight_data).c;
        local_a38.cstep = (this->weight_data).cstep;
      }
      if ((Mat *)&local_9f8 != &this->bias_data) {
        piVar4 = (this->bias_data).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(uStack_9ec,uStack_9f0);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_9d8 == (Allocator *)0x0) {
              if (local_9f8 != (void *)0x0) {
                free(local_9f8);
              }
            }
            else {
              (**(code **)(*(long *)local_9d8 + 0x18))();
            }
          }
        }
        local_9f8 = (this->bias_data).data;
        piVar4 = (this->bias_data).refcount;
        uStack_9f0 = SUB84(piVar4,0);
        uStack_9ec = (undefined4)((ulong)piVar4 >> 0x20);
        sVar5 = (this->bias_data).elemsize;
        uStack_9e8 = (undefined4)sVar5;
        uStack_9e4 = (undefined4)(sVar5 >> 0x20);
        iStack_9e0 = (this->bias_data).elempack;
        local_9d8 = (this->bias_data).allocator;
        local_9d0._0_4_ = (this->bias_data).dims;
        local_9d0._4_4_ = (this->bias_data).w;
        uStack_9c8._0_4_ = (this->bias_data).h;
        uStack_9c8._4_4_ = (this->bias_data).c;
        local_9c0 = (this->bias_data).cstep;
      }
      if (this->int8_scale_term != 0) {
        if ((Mat *)&local_9b8 != &this->weight_data_int8_scales) {
          piVar4 = (this->weight_data_int8_scales).refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = (int *)CONCAT44(uStack_9ac,uStack_9b0);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_998 == (Allocator *)0x0) {
                if (local_9b8 != (void *)0x0) {
                  free(local_9b8);
                }
              }
              else {
                (**(code **)(*(long *)local_998 + 0x18))();
              }
            }
          }
          local_9b8 = (this->weight_data_int8_scales).data;
          piVar4 = (this->weight_data_int8_scales).refcount;
          uStack_9b0 = SUB84(piVar4,0);
          uStack_9ac = (undefined4)((ulong)piVar4 >> 0x20);
          sVar5 = (this->weight_data_int8_scales).elemsize;
          uStack_9a8 = (undefined4)sVar5;
          uStack_9a4 = (undefined4)(sVar5 >> 0x20);
          iStack_9a0 = (this->weight_data_int8_scales).elempack;
          local_998 = (this->weight_data_int8_scales).allocator;
          local_990._0_4_ = (this->weight_data_int8_scales).dims;
          local_990._4_4_ = (this->weight_data_int8_scales).w;
          uStack_988._0_4_ = (this->weight_data_int8_scales).h;
          uStack_988._4_4_ = (this->weight_data_int8_scales).c;
          local_980 = (this->weight_data_int8_scales).cstep;
        }
        local_ac8.super_ModelBin._vptr_ModelBin = (_func_int **)&this->bottom_blob_int8_scale;
        local_ac8.weights = (Mat *)0x0;
        uStack_ab8 = 4;
        uStack_ab0 = 1;
        local_aa8 = (long *)0x0;
        local_aa0 = 2;
        uStack_a9c = 1;
        uStack_a98 = 4;
        uStack_a94 = 1;
        local_a90 = 4;
        piVar4 = (int *)CONCAT44(uStack_96c,uStack_970);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_958 == (long *)0x0) {
              if (local_978 != (float *)0x0) {
                free(local_978);
              }
            }
            else {
              (**(code **)(*local_958 + 0x18))();
            }
          }
        }
        local_978 = (float *)local_ac8.super_ModelBin._vptr_ModelBin;
        uStack_970 = SUB84(local_ac8.weights,0);
        uStack_96c = (undefined4)((ulong)local_ac8.weights >> 0x20);
        uStack_968 = (undefined4)uStack_ab8;
        uStack_964 = (undefined4)((ulong)uStack_ab8 >> 0x20);
        uStack_960 = uStack_ab0;
        local_958 = local_aa8;
        local_950 = local_aa0;
        uStack_94c = uStack_a9c;
        uStack_948 = uStack_a98;
        uStack_944 = uStack_a94;
        local_940 = local_a90;
        if (local_ac8.weights != (Mat *)0x0) {
          LOCK();
          *(int *)&(local_ac8.weights)->data = *(int *)&(local_ac8.weights)->data + -1;
          UNLOCK();
          if (*(int *)&(local_ac8.weights)->data == 0) {
            if (local_aa8 == (long *)0x0) {
              if (local_ac8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                free(local_ac8.super_ModelBin._vptr_ModelBin);
              }
            }
            else {
              (**(code **)(*local_aa8 + 0x18))();
            }
          }
        }
        uStack_ab8 = 0;
        uStack_ab0 = 0;
        local_ac8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_ac8.weights = (Mat *)0x0;
        local_aa0 = 0;
        uStack_a9c = 0;
        uStack_a98 = 0;
        uStack_a94 = 0;
        local_a90 = 0;
      }
      ModelBinFromMatArray::ModelBinFromMatArray(&local_ac8,&local_a38);
      (*pLVar13->_vptr_Layer[3])(pLVar13,&local_ac8);
      ModelBin::~ModelBin(&local_ac8.super_ModelBin);
      (*pLVar13->_vptr_Layer[4])(pLVar13,opt);
      (*pLVar13->_vptr_Layer[7])(pLVar13,bottom_blob,top_blob,opt);
      (*pLVar13->_vptr_Layer[1])(pLVar13);
      lVar14 = 0xc0;
      do {
        piVar4 = *(int **)((long)&local_a38.refcount + lVar14);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar6 = *(void **)((long)&local_a38.data + lVar14);
            plVar7 = *(long **)((long)&local_a38.allocator + lVar14);
            if (plVar7 == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_a38.refcount + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_a38.elemsize + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_a38.data + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.refcount + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.dims + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.h + lVar14) = 0;
        *(undefined8 *)((long)&local_a38.cstep + lVar14) = 0;
        lVar14 = lVar14 + -0x40;
      } while (lVar14 != -0x40);
      lVar14 = 0x8c0;
      do {
        piVar4 = *(int **)(local_938 + lVar14 + 8);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (*(long **)((long)&local_918 + lVar14) == (long *)0x0) {
              if (*(void **)(local_938 + lVar14) != (void *)0x0) {
                free(*(void **)(local_938 + lVar14));
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_918 + lVar14) + 0x18))();
            }
          }
        }
        *(undefined8 *)(local_938 + lVar14 + 0xc) = 0;
        *(undefined8 *)(local_938 + lVar14 + 0x14) = 0;
        *(undefined8 *)(local_938 + lVar14) = 0;
        *(undefined8 *)(local_938 + lVar14 + 8) = 0;
        *(undefined8 *)((long)&stack0xfffffffffffff6f0 + lVar14) = 0;
        *(undefined8 *)((long)asStack_900 + lVar14 + -8) = 0;
        *(undefined8 *)((long)asStack_900 + lVar14) = 0;
        lVar14 = lVar14 + -0x48;
      } while (lVar14 != -0x40);
      if (iVar9 == iVar18) {
        return 0;
      }
    }
  }
  uVar1 = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  iVar9 = this->kernel_w;
  iVar18 = this->kernel_h;
  iVar2 = this->dilation_w;
  iVar3 = this->dilation_h;
  local_938._16_4_ = 0;
  local_938._20_4_ = 0;
  local_938._24_4_ = 0;
  local_938._0_8_ = (void *)0x0;
  local_938._8_4_ = 0;
  local_938._12_4_ = 0;
  local_918 = (Allocator *)0x0;
  pAStack_910 = (Allocator *)0x0;
  local_908._0_4_ = 0;
  local_908._4_4_ = 0;
  asStack_900[0] = 0;
  make_padding(this,bottom_blob,(Mat *)local_938,opt);
  iVar12 = -100;
  if (((void *)local_938._0_8_ != (void *)0x0) && ((long)local_908._4_4_ * asStack_900[0] != 0)) {
    iVar12 = iStack_90c;
    uVar21 = (long)(~((iVar9 + -1) * iVar2) + iStack_90c) / (long)this->stride_w;
    uVar22 = uVar21 & 0xffffffff;
    iVar9 = (~((iVar18 + -1) * iVar3) + (int)local_908) / this->stride_h;
    uVar10 = this->kernel_w * this->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_a38,(long)(int)uVar10,
               (allocator_type *)&local_ac8);
    pvVar6 = local_a38.data;
    _w = (int)uVar21 + 1;
    if (0 < this->kernel_h) {
      iVar18 = this->dilation_h;
      iVar2 = this->dilation_w;
      iVar3 = this->kernel_w;
      iVar11 = 0;
      iVar15 = 0;
      iVar20 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar14 = 0;
          do {
            *(int *)((long)local_a38.data + (iVar15 + lVar14) * 4) = iVar20;
            iVar20 = iVar20 + this->dilation_w;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 < this->kernel_w);
          iVar15 = iVar15 + (int)lVar14;
        }
        iVar20 = iVar20 + (iVar12 * iVar18 - iVar2 * iVar3);
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->kernel_h);
    }
    Mat::create(top_blob,_w,iVar9 + 1,this->num_output,sVar5,opt->blob_allocator);
    iVar12 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      local_a78 = (long)this->num_output;
      if (0 < local_a78) {
        local_a80 = top_blob->data;
        local_a88 = top_blob->cstep * top_blob->elemsize;
        local_a70 = (long)(int)_w;
        uVar21 = (ulong)_w;
        iVar18 = 0;
        local_b10 = 0;
        local_a68 = uVar22;
        local_a60 = uVar21;
        do {
          if (-1 < iVar9) {
            local_b20 = (void *)(local_a88 * local_b10 + (long)local_a80);
            iVar2 = this->bias_term;
            iVar3 = this->activation_type;
            local_a58 = (void *)((long)iVar18 * 4 + (long)(this->weight_data).data);
            iVar12 = 0;
            do {
              if (-1 < (int)uVar22) {
                pfVar8 = (float *)(this->activation_params).data;
                local_a40 = (this->bias_data).data;
                lVar14 = asStack_900[0] * CONCAT44(local_938._20_4_,local_938._16_4_);
                local_a48 = (void *)((long)(iStack_90c * iVar12 * this->stride_h) *
                                     CONCAT44(local_938._20_4_,local_938._16_4_) + local_938._0_8_);
                local_a50 = (long)this->stride_w;
                uVar22 = 0;
                do {
                  if (iVar2 == 0) {
                    fVar24 = 0.0;
                  }
                  else {
                    fVar24 = *(float *)((long)local_a40 + local_b10 * 4);
                  }
                  if (0 < (int)uVar1) {
                    uVar17 = 0;
                    pvVar16 = local_a58;
                    do {
                      if (0 < (int)uVar10) {
                        uVar19 = 0;
                        do {
                          fVar24 = fVar24 + *(float *)((long)pvVar16 + uVar19 * 4) *
                                            *(float *)((long)local_a48 +
                                                      (long)*(int *)((long)pvVar6 + uVar19 * 4) * 4
                                                      + lVar14 * uVar17 + uVar22 * local_a50 * 4);
                          uVar19 = uVar19 + 1;
                        } while (uVar10 != uVar19);
                      }
                      uVar17 = uVar17 + 1;
                      pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar10 * 4);
                    } while (uVar17 != uVar1);
                  }
                  switch(iVar3) {
                  case 1:
                    if (fVar24 <= 0.0) {
                      fVar24 = 0.0;
                    }
                    break;
                  case 2:
                    fVar24 = fVar24 * (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar8 |
                                             -(uint)(0.0 < fVar24) & 0x3f800000);
                    break;
                  case 3:
                    if (fVar24 <= *pfVar8) {
                      fVar24 = *pfVar8;
                    }
                    if (pfVar8[1] < fVar24) {
                      fVar24 = pfVar8[1];
                    }
                    break;
                  case 4:
                    fVar24 = expf(-fVar24);
                    uVar21 = local_a60;
                    fVar24 = 1.0 / (fVar24 + 1.0);
                  }
                  *(float *)((long)local_b20 + uVar22 * 4) = fVar24;
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar21);
              }
              local_b20 = (void *)((long)local_b20 + local_a70 * 4);
              bVar23 = iVar12 != iVar9;
              uVar22 = local_a68;
              iVar12 = iVar12 + 1;
            } while (bVar23);
          }
          local_b10 = local_b10 + 1;
          iVar18 = iVar18 + uVar1 * uVar10;
        } while (local_b10 != local_a78);
      }
      iVar12 = 0;
    }
    if (local_a38.data != (void *)0x0) {
      operator_delete(local_a38.data,
                      CONCAT44(local_a38.elemsize._4_4_,(undefined4)local_a38.elemsize) -
                      (long)local_a38.data);
    }
  }
  piVar4 = (int *)CONCAT44(local_938._12_4_,local_938._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_918 == (Allocator *)0x0) {
        if ((void *)local_938._0_8_ != (void *)0x0) {
          free((void *)local_938._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_918 + 0x18))();
      }
    }
  }
  return iVar12;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}